

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cxx
# Opt level: O2

void __thiscall
trento::Event::compute_reduced_thickness<double(*)(double,double)>
          (Event *this,_func_double_double_double *gen_mean)

{
  double dVar1;
  undefined1 auVar2 [16];
  int iVar3;
  long lVar4;
  int ix;
  long lVar5;
  long lVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 uVar11;
  undefined1 auVar10 [16];
  undefined1 in_ZMM1 [64];
  undefined8 in_XMM4_Qb;
  double local_68;
  undefined1 local_58 [16];
  
  iVar3 = this->nsteps_;
  local_58 = ZEXT816(0);
  local_68 = 0.0;
  for (lVar6 = 0; lVar6 < iVar3; lVar6 = lVar6 + 1) {
    uVar11 = in_ZMM1._8_8_;
    lVar5 = 0;
    while (lVar5 < iVar3) {
      dVar1 = this->norm_;
      dVar7 = (*gen_mean)((this->TA_).super_multi_array_ref<double,_2UL>.
                          super_const_multi_array_ref<double,_2UL,_double_*>.base_
                          [(this->TA_).super_multi_array_ref<double,_2UL>.
                           super_const_multi_array_ref<double,_2UL,_double_*>.origin_offset_ +
                           (this->TA_).super_multi_array_ref<double,_2UL>.
                           super_const_multi_array_ref<double,_2UL,_double_*>.stride_list_.elems[0]
                           * lVar6 + (this->TA_).super_multi_array_ref<double,_2UL>.
                                     super_const_multi_array_ref<double,_2UL,_double_*>.stride_list_
                                     .elems[1] * lVar5],
                          (this->TB_).super_multi_array_ref<double,_2UL>.
                          super_const_multi_array_ref<double,_2UL,_double_*>.base_
                          [(this->TB_).super_multi_array_ref<double,_2UL>.
                           super_const_multi_array_ref<double,_2UL,_double_*>.origin_offset_ +
                           (this->TB_).super_multi_array_ref<double,_2UL>.
                           super_const_multi_array_ref<double,_2UL,_double_*>.stride_list_.elems[0]
                           * lVar6 + (this->TB_).super_multi_array_ref<double,_2UL>.
                                     super_const_multi_array_ref<double,_2UL,_double_*>.stride_list_
                                     .elems[1] * lVar5]);
      dVar7 = dVar7 * dVar1;
      auVar10._0_8_ = (double)(int)lVar5;
      auVar10._8_8_ = in_XMM4_Qb;
      auVar2._8_8_ = uVar11;
      auVar2._0_8_ = (double)(int)lVar6;
      auVar9 = vunpcklpd_avx(auVar10,auVar2);
      in_ZMM1 = ZEXT1664(auVar9);
      local_68 = local_68 + dVar7;
      lVar4 = (this->TR_).super_multi_array_ref<double,_2UL>.
              super_const_multi_array_ref<double,_2UL,_double_*>.stride_list_.elems[1] * lVar5;
      lVar5 = lVar5 + 1;
      (this->TR_).super_multi_array_ref<double,_2UL>.
      super_const_multi_array_ref<double,_2UL,_double_*>.base_
      [(this->TR_).super_multi_array_ref<double,_2UL>.
       super_const_multi_array_ref<double,_2UL,_double_*>.origin_offset_ +
       (this->TR_).super_multi_array_ref<double,_2UL>.
       super_const_multi_array_ref<double,_2UL,_double_*>.stride_list_.elems[0] * lVar6 + lVar4] =
           dVar7;
      auVar8._8_8_ = dVar7;
      auVar8._0_8_ = dVar7;
      iVar3 = this->nsteps_;
      local_58 = vfmadd231pd_fma(local_58,auVar9,auVar8);
    }
  }
  this->multiplicity_ = local_68 * this->dxy_ * this->dxy_;
  auVar9._8_8_ = local_68;
  auVar9._0_8_ = local_68;
  auVar9 = vdivpd_avx(local_58,auVar9);
  this->ixcm_ = (double)auVar9._0_8_;
  this->iycm_ = (double)auVar9._8_8_;
  return;
}

Assistant:

void Event::compute_reduced_thickness(GenMean gen_mean) {
  double sum = 0.;
  double ixcm = 0.;
  double iycm = 0.;

  for (int iy = 0; iy < nsteps_; ++iy) {
    for (int ix = 0; ix < nsteps_; ++ix) {
      auto t = norm_ * gen_mean(TA_[iy][ix], TB_[iy][ix]);
      TR_[iy][ix] = t;
      sum += t;
      // Center of mass grid indices.
      // No need to multiply by dxy since it would be canceled later.
      ixcm += t * static_cast<double>(ix);
      iycm += t * static_cast<double>(iy);
    }
  }

  multiplicity_ = dxy_ * dxy_ * sum;
  ixcm_ = ixcm / sum;
  iycm_ = iycm / sum;
}